

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  double dVar5;
  Slot *slot;
  uint codepoint_local;
  GLFWwindow *window_local;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar5 = glfwGetTime();
  pcVar4 = get_character_string(codepoint);
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",dVar5,(ulong)uVar2,(ulong)uVar1,
         (ulong)codepoint,pcVar4);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",
           counter++, slot->number, glfwGetTime(), codepoint,
           get_character_string(codepoint));
}